

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

Vec_Ptr_t *
Llb_ImgSupports(Aig_Man_t *p,Vec_Ptr_t *vDdMans,Vec_Int_t *vStart,Vec_Int_t *vStop,int fAddPis,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  DdManager *pDVar4;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar5;
  DdNode *n;
  DdNode *pDVar6;
  Aig_Obj_t *pAVar7;
  int local_7c;
  int local_78;
  int Counter;
  int k;
  int nSize;
  int Entry;
  int i;
  DdNode *bTemp;
  DdNode *bSupp;
  DdManager *dd;
  Aig_Obj_t *pObj;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vSupps;
  int fVerbose_local;
  int fAddPis_local;
  Vec_Int_t *vStop_local;
  Vec_Int_t *vStart_local;
  Vec_Ptr_t *vDdMans_local;
  Aig_Man_t *p_local;
  
  pDVar4 = (DdManager *)Vec_PtrEntry(vDdMans,0);
  iVar1 = Cudd_ReadSize(pDVar4);
  p_00 = Vec_PtrAlloc(100);
  pVVar5 = Vec_IntStart(iVar1);
  for (nSize = 0; iVar2 = Vec_IntSize(vStart), nSize < iVar2; nSize = nSize + 1) {
    iVar2 = Vec_IntEntry(vStart,nSize);
    Vec_IntWriteEntry(pVVar5,iVar2,1);
  }
  Vec_PtrPush(p_00,pVVar5);
  for (nSize = 0; iVar2 = Vec_PtrSize(vDdMans), nSize < iVar2; nSize = nSize + 1) {
    pDVar4 = (DdManager *)Vec_PtrEntry(vDdMans,nSize);
    pVVar5 = Vec_IntStart(iVar1);
    n = Cudd_Support(pDVar4,pDVar4->bFunc);
    Cudd_Ref(n);
    for (_Entry = n; pDVar6 = Cudd_ReadOne(pDVar4), _Entry != pDVar6; _Entry = (_Entry->type).kids.T
        ) {
      Vec_IntWriteEntry(pVVar5,_Entry->index,1);
    }
    Cudd_RecursiveDeref(pDVar4,n);
    Vec_PtrPush(p_00,pVVar5);
  }
  pVVar5 = Vec_IntStart(iVar1);
  for (nSize = 0; iVar2 = Vec_IntSize(vStop), nSize < iVar2; nSize = nSize + 1) {
    iVar2 = Vec_IntEntry(vStop,nSize);
    Vec_IntWriteEntry(pVVar5,iVar2,1);
  }
  if (fAddPis != 0) {
    for (nSize = 0; iVar2 = Saig_ManPiNum(p), nSize < iVar2; nSize = nSize + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,nSize);
      iVar2 = Aig_ObjId(pAVar7);
      Vec_IntWriteEntry(pVVar5,iVar2,1);
    }
  }
  Vec_PtrPush(p_00,pVVar5);
  iVar2 = Aig_ManObjNumMax(p);
  if (iVar1 == iVar2) {
    if (fVerbose != 0) {
      for (nSize = 0; iVar1 = Vec_PtrSize(p->vObjs), nSize < iVar1; nSize = nSize + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,nSize);
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          local_7c = 0;
          for (local_78 = 0; iVar1 = Vec_PtrSize(p_00), local_78 < iVar1; local_78 = local_78 + 1) {
            pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,local_78);
            iVar1 = Vec_IntEntry(pVVar5,nSize);
            local_7c = iVar1 + local_7c;
          }
          if (local_7c != 0) {
            printf("Obj = %4d : ",(ulong)(uint)nSize);
            iVar1 = Saig_ObjIsPi(p,pAVar7);
            if (iVar1 == 0) {
              iVar1 = Saig_ObjIsLo(p,pAVar7);
              if (iVar1 == 0) {
                iVar1 = Saig_ObjIsLi(p,pAVar7);
                if (iVar1 == 0) {
                  iVar1 = Aig_ObjIsNode(pAVar7);
                  if (iVar1 != 0) {
                    printf("and ");
                  }
                }
                else {
                  printf("li  ");
                }
              }
              else {
                printf("lo  ");
              }
            }
            else {
              printf("pi  ");
            }
            for (local_78 = 0; iVar1 = Vec_PtrSize(p_00), local_78 < iVar1; local_78 = local_78 + 1)
            {
              pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,local_78);
              uVar3 = Vec_IntEntry(pVVar5,nSize);
              printf("%d",(ulong)uVar3);
            }
            printf("\n");
          }
        }
      }
    }
    return p_00;
  }
  __assert_fail("nSize == Aig_ManObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Image.c"
                ,0x53,
                "Vec_Ptr_t *Llb_ImgSupports(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
               );
}

Assistant:

Vec_Ptr_t * Llb_ImgSupports( Aig_Man_t * p, Vec_Ptr_t * vDdMans, Vec_Int_t * vStart, Vec_Int_t * vStop, int fAddPis, int fVerbose )
{
    Vec_Ptr_t * vSupps;
    Vec_Int_t * vOne;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bSupp, * bTemp;
    int i, Entry, nSize;
    nSize  = Cudd_ReadSize( (DdManager *)Vec_PtrEntry( vDdMans, 0 ) );
    vSupps = Vec_PtrAlloc( 100 );
    // create initial
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStart, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    Vec_PtrPush( vSupps, vOne );
    // create intermediate 
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        vOne  = Vec_IntStart( nSize );
        bSupp = Cudd_Support( dd, dd->bFunc );  Cudd_Ref( bSupp );
        for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
            Vec_IntWriteEntry( vOne, bTemp->index, 1 );
        Cudd_RecursiveDeref( dd, bSupp );
        Vec_PtrPush( vSupps, vOne );
    }
    // create final
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStop, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    if ( fAddPis )
        Saig_ManForEachPi( p, pObj, i )
            Vec_IntWriteEntry( vOne, Aig_ObjId(pObj), 1 );
    Vec_PtrPush( vSupps, vOne );

    // print supports
    assert( nSize == Aig_ManObjNumMax(p) );
    if ( !fVerbose )
        return vSupps;
    Aig_ManForEachObj( p, pObj, i )
    {
        int k, Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            Counter += Vec_IntEntry(vOne, i);
        if ( Counter == 0 ) 
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Saig_ObjIsLi(p,pObj) )
            printf( "li  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            printf( "%d", Vec_IntEntry(vOne, i) );
        printf( "\n" );
    }
    return vSupps;
}